

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<ExprPointerLiteral_*,_32U>::~SmallArray(SmallArray<ExprPointerLiteral_*,_32U> *this)

{
  ExprPointerLiteral **ppEVar1;
  
  ppEVar1 = this->data;
  if (ppEVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppEVar1 != (ExprPointerLiteral **)0x0) {
        (*(code *)NULLC::dealloc)(ppEVar1);
      }
    }
    else if (ppEVar1 != (ExprPointerLiteral **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}